

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

Optional<Corrade::Containers::Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>_> *
__thiscall
Corrade::Utility::String::parseNumberSequence
          (Optional<Corrade::Containers::Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>_>
           *__return_storage_ptr__,String *this,StringView string,uint32_t min,uint32_t max)

{
  StringView value;
  bool bVar1;
  Optional<Corrade::Containers::Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>_>
  *pOVar2;
  byte *pbVar3;
  uint *puVar4;
  Debug *pDVar5;
  ostream *output;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong i;
  bool bVar11;
  bool bVar12;
  StringView value_00;
  uint32_t number;
  char c;
  Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> out;
  uint local_a4;
  undefined4 local_a0;
  byte local_99;
  Optional<Corrade::Containers::Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>_>
  *local_98;
  uint local_90;
  uint32_t local_8c;
  Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> local_88;
  BasicStringView<const_char> local_68;
  Error local_58;
  uint uVar10;
  
  local_68._sizePlusFlags = (size_t)string._data;
  local_90 = (uint)string._sizePlusFlags;
  local_88._data = (uint *)0x0;
  local_88._size = 0;
  local_88._deleter = (_func_void_uint_ptr_unsigned_long *)0x0;
  local_a4 = 0;
  uVar7 = local_68._sizePlusFlags & 0x3fffffffffffffff;
  local_a0 = (undefined4)CONCAT71((int7)((ulong)&local_a4 >> 8),__return_storage_ptr__->_set);
  uVar8 = 0xffffffff;
  bVar1 = false;
  bVar11 = false;
  i = 0;
  local_98 = __return_storage_ptr__;
  local_8c = min;
  local_68._data = (char *)this;
  do {
    if (i == uVar7) {
      local_99 = 0;
    }
    else {
      pbVar3 = (byte *)Containers::BasicStringView<const_char>::operator[](&local_68,i);
      local_99 = *pbVar3;
    }
    if ((i == (local_68._sizePlusFlags & 0x3fffffffffffffff)) ||
       ((local_99 < 0x3c && ((0x800100100003e00U >> ((ulong)local_99 & 0x3f) & 1) != 0)))) {
      if (bVar11) {
        bVar11 = false;
      }
      else if (uVar8 == 0xffffffff) {
        uVar8 = 0xffffffff;
        if ((bVar1) && (local_a4 < local_8c && local_90 <= local_a4)) {
          uVar7 = local_88._size;
          if (local_88._deleter == Containers::ArrayMallocAllocator<unsigned_int>::deleter) {
            uVar7 = *(long *)(local_88._data + -2) - 8U >> 2;
          }
          if ((ulong)((long)&local_a4 - (long)local_88._data >> 2) < uVar7) {
            local_98->_set = SUB41(local_a0,0);
            output = Error::defaultOutput();
            Error::Error(&local_58,output,(Flags)0x0);
            Debug::operator<<(&local_58.super_Debug,
                              "Containers::arrayAppend(): use the list variant to append values from within the array itself"
                             );
            Error::~Error(&local_58);
            abort();
          }
          puVar4 = Containers::Implementation::
                   arrayGrowBy<unsigned_int,Corrade::Containers::ArrayMallocAllocator<unsigned_int>>
                             (&local_88,1);
          *puVar4 = local_a4;
        }
      }
      else {
        uVar10 = local_a4 + 1;
        if (local_8c <= local_a4) {
          uVar10 = local_8c;
        }
        if (!bVar1) {
          uVar10 = local_8c;
        }
        uVar9 = uVar10 - uVar8;
        if (uVar8 <= uVar10 && uVar9 != 0) {
          puVar4 = Containers::Implementation::
                   arrayGrowBy<unsigned_int,Corrade::Containers::ArrayMallocAllocator<unsigned_int>>
                             (&local_88,(ulong)uVar9);
          lVar6 = 0;
          do {
            *(uint *)((long)puVar4 + lVar6) = uVar8;
            uVar8 = uVar8 + 1;
            lVar6 = lVar6 + 4;
          } while ((ulong)uVar9 << 2 != lVar6);
        }
        uVar8 = 0xffffffff;
      }
LAB_001230e5:
      local_a4 = 0;
      bVar12 = true;
      bVar1 = false;
    }
    else if ((byte)(local_99 - 0x30) < 10) {
      uVar7 = (ulong)(byte)(local_99 - 0x30) + (ulong)local_a4 * 10;
      local_a4 = (uint)uVar7;
      if (uVar7 >> 0x20 != 0) {
        bVar11 = true;
      }
      bVar12 = true;
      bVar1 = true;
    }
    else {
      if (local_99 == 0x2d) {
        if (local_a4 <= local_90) {
          local_a4 = local_90;
        }
        uVar8 = local_a4;
        if (!bVar1) {
          uVar8 = local_90;
        }
        goto LAB_001230e5;
      }
      Error::Error(&local_58,(Flags)0x0);
      pDVar5 = Debug::operator<<(&local_58.super_Debug,
                                 "Utility::parseNumberSequence(): unrecognized character");
      value_00._sizePlusFlags = 1;
      value_00._data = (char *)&local_99;
      pDVar5 = Debug::operator<<(pDVar5,value_00);
      pDVar5 = Debug::operator<<(pDVar5,"in");
      value._sizePlusFlags = local_68._sizePlusFlags;
      value._data = local_68._data;
      Debug::operator<<(pDVar5,value);
      Error::~Error(&local_58);
      local_a0 = 0;
      bVar12 = false;
    }
    pOVar2 = local_98;
    if (!bVar12) {
      local_98->_set = SUB41(local_a0,0);
      goto LAB_001231dc;
    }
    uVar7 = local_68._sizePlusFlags & 0x3fffffffffffffff;
    bVar12 = uVar7 <= i;
    i = i + 1;
    if (bVar12) {
      local_98->_set = true;
      (local_98->field_0)._value._data = local_88._data;
      (local_98->field_0)._value._size = local_88._size;
      (local_98->field_0)._value._deleter = local_88._deleter;
      local_88._data = (uint *)0x0;
      local_88._size = 0;
      local_88._deleter = (_func_void_uint_ptr_unsigned_long *)0x0;
LAB_001231dc:
      Containers::Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>::~Array(&local_88);
      return pOVar2;
    }
  } while( true );
}

Assistant:

Containers::Optional<Containers::Array<std::uint32_t>> parseNumberSequence(const Containers::StringView string, const std::uint32_t min, const std::uint32_t max) {
    Containers::Array<std::uint32_t> out;

    bool hasNumber = false; /* whether we have a number already */
    std::uint32_t number = 0; /* value of that number */
    bool overflow = false; /* if we've overflown the 32 bits during parsing */
    std::uint32_t rangeStart = ~0u; /* if not ~0u, we're in a range */

    /* Going through one iteration more in order to handle the end-of-string
       condition in the same place as delimiters */
    for(std::size_t i = 0; i <= string.size(); ++i) {
        const char c = i == string.size() ? 0 : string[i];

        /* End of string or a delimiter */
        if(i == string.size() || c == ',' || c == ';' || c == ' ' || c == '\t' || c == '\f' || c == '\v' || c == '\r' || c == '\n') {
            /* If anything has overflown, ignore this piece completely and
               reset the bit again */
            if(overflow) {
                overflow = false;

            /* If we are in a range, fill it. Clamp range end to the soecified
               bounds as well, worst case the loop will not iterate at all. */
            } else if(rangeStart != ~std::uint32_t{}) {
                const std::uint32_t rangeEnd = hasNumber && number < max ? number + 1 : max;

                /* If the range is non-empty, add an uninitialized sequence to
                   the array and then fill it. Should be vastly more efficient
                   for large ranges than arrayAppend() in a loop. */
                if(rangeEnd > rangeStart)
                    for(std::uint32_t& j: arrayAppend(out, NoInit, rangeEnd - rangeStart))
                        j = rangeStart++;
                rangeStart = ~std::uint32_t{};

            /* Otherwise, if we have just one number, save it to the output if
               it's in bounds.*/
            } else if(hasNumber && number >= min && number < max) {
                arrayAppend(out, number);

            /* If we have nothing, there was multiple delimiters after each
               other. */
            }

            hasNumber = false;
            number = 0;

        /* Number */
        } else if(c >= '0' && c <= '9') {
            hasNumber = true;

            /* If there's an overflow, remember that to discard the whole piece
               later. Apparently I can't actually test for overflow with
               `number < next` (huh? why did I think it would work?) so going
               with a bigger type for the multiplication. Answers at
               https://stackoverflow.com/a/1815371 are mostly just crap, using
               a *division* to test if a multiplication overflowed?! */
            const std::uint64_t next = std::uint64_t{number}*10 + (c - '0');
            if(next > ~std::uint32_t{}) overflow = true;

            number = next;

        /* Range specification */
        } else if(c == '-') {
            /* If we have a number, remember it as a range start if it's in
               bounds. Otherwise use the min value. */
            rangeStart = hasNumber && number >= min ? number : min;

            hasNumber = false;
            number = 0;

        /* Something weird, bail */
        } else {
            /** @todo sanitize when Debug::chr / Debug::str is done */
            Error{} << "Utility::parseNumberSequence(): unrecognized character" << Containers::StringView{&c, 1} << "in" << string;
            return {};
        }
    }

    /* GCC 4.8 decases when seeing just `return out` here */
    return Containers::optional(Utility::move(out));
}